

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fingergeometry.cpp
# Opt level: O0

int QtMWidgets::FingerGeometry::height(void)

{
  int iVar1;
  double *pdVar2;
  double local_28 [3];
  double local_10;
  
  if (height()::h == '\0') {
    iVar1 = __cxa_guard_acquire(&height()::h);
    if (iVar1 != 0) {
      QGuiApplication::primaryScreen();
      local_10 = (double)QScreen::logicalDotsPerInchY();
      QGuiApplication::primaryScreen();
      local_28[0] = (double)QScreen::physicalDotsPerInchY();
      pdVar2 = qMax<double>(&local_10,local_28);
      height::h = qRound(*pdVar2 * 0.393700787);
      __cxa_guard_release(&height()::h);
    }
  }
  return height::h;
}

Assistant:

int
FingerGeometry::height()
{
#ifdef Q_OS_ANDROID

	static const int h =
		qRound( qgetenv( "QT_ANDROID_THEME_DISPLAY_DPI" ).toDouble() *
			fingerSize );

	return h;

#else

	static const int h =
		qRound(
			(qreal) qMax( QApplication::primaryScreen()->logicalDotsPerInchY(),
				QApplication::primaryScreen()->physicalDotsPerInchY() ) *
			fingerSize );

	return h;

#endif
}